

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_init_eb2.cpp
# Opt level: O1

void __thiscall NavierStokesBase::initialize_eb2_structs(NavierStokesBase *this)

{
  BaseFab<int> *pBVar1;
  EBCellFlagFab *this_00;
  char cVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  FabArray<amrex::EBCellFlagFab> *pFVar5;
  NavierStokesBase *pNVar6;
  FabType FVar7;
  long lVar8;
  MultiFab *pMVar9;
  MultiCutFab *pMVar10;
  FabArray<amrex::EBCellFlagFab> *pFVar11;
  int *piVar12;
  int iVar13;
  int *piVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  Box bx;
  BoxIterator bit;
  Box tbox;
  MFIter mfi;
  Box local_26c;
  FabArray<amrex::EBCellFlagFab> *local_250;
  NavierStokesBase *local_248;
  FabArray<amrex::BaseFab<int>_> *local_240;
  undefined1 local_238 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  int local_210;
  Box local_b0;
  MFIter local_90;
  
  local_238._8_8_ = amrex::OutStream();
  local_238._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
  local_238._0_4_ = *(int *)(DAT_00756620 + -0x30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
  *(undefined8 *)
   ((long)&local_228.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish +
   local_228.
   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
       *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_228,"Initializing EB2 structs",0x18);
  cVar2 = (char)(ostringstream *)&local_228;
  std::ios::widen((char)local_228.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  amrex::Print::~Print((Print *)local_238);
  no_eb_in_domain = false;
  local_240 = &this->ebmask;
  local_238._0_8_ = (MultiCutFab *)0x1;
  local_238._8_8_ = (MultiCutFab *)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.smallend.vect._0_8_ = &PTR__FabFactory_0074ebe8;
  local_90.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  local_90.fabArray._0_4_ = 0;
  (*(this->ebmask).super_FabArrayBase._vptr_FabArrayBase[3])
            (local_240,&(this->super_AmrLevel).grids,&(this->super_AmrLevel).dmap,1,&local_90,
             local_238,&local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  lVar8 = __dynamic_cast((this->super_AmrLevel).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                         &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (lVar8 == 0) {
    __cxa_bad_cast();
  }
  pMVar9 = amrex::EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar8 + 0xd8));
  this->volfrac = pMVar9;
  pMVar10 = amrex::EBDataCollection::getBndryCent(*(EBDataCollection **)(lVar8 + 0xd8));
  this->bndrycent = pMVar10;
  amrex::EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar8 + 0xd8));
  (this->areafrac)._M_elems[2] =
       (MultiCutFab *)
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->areafrac)._M_elems[0] = (MultiCutFab *)local_238._0_8_;
  (this->areafrac)._M_elems[1] = (MultiCutFab *)local_238._8_8_;
  amrex::EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar8 + 0xd8));
  (this->facecent)._M_elems[2] =
       (MultiCutFab *)
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->facecent)._M_elems[0] = (MultiCutFab *)local_238._0_8_;
  (this->facecent)._M_elems[1] = (MultiCutFab *)local_238._8_8_;
  pFVar11 = amrex::EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar8 + 0xd8));
  amrex::MFIter::MFIter(&local_90,(FabArrayBase *)this->volfrac,false);
  pFVar5 = pFVar11;
  pNVar6 = this;
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      local_248 = pNVar6;
      local_250 = pFVar5;
      piVar12 = &local_90.currentIndex;
      piVar14 = piVar12;
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar14 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_90.currentIndex;
      }
      pBVar1 = (this->ebmask).m_fabs_v.
               super__Vector_base<amrex::BaseFab<int>_*,_std::allocator<amrex::BaseFab<int>_*>_>.
               _M_impl.super__Vector_impl_data._M_start[*piVar14];
      amrex::MFIter::growntilebox(&local_b0,&local_90,-1000000);
      amrex::MFIter::tilebox(&local_26c,&local_90);
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar12 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_90.currentIndex;
      }
      this_00 = (pFVar11->m_fabs_v).
                super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
                _M_impl.super__Vector_impl_data._M_start[*piVar12];
      FVar7 = amrex::EBCellFlagFab::getType(this_00,&local_b0);
      if (FVar7 == covered) {
        amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                  ((Array4<int> *)local_238,local_240,&local_90);
        this = local_248;
        pFVar11 = local_250;
        if (local_26c.smallend.vect[2] <= local_26c.bigend.vect[2]) {
          iVar13 = local_26c.smallend.vect[2];
          do {
            if (local_26c.smallend.vect[1] <= local_26c.bigend.vect[1]) {
              iVar17 = local_26c.smallend.vect[1];
              do {
                if (local_26c.smallend.vect[0] <= local_26c.bigend.vect[0]) {
                  iVar16 = local_26c.smallend.vect[0] -
                           (int)local_228.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  iVar18 = (local_26c.bigend.vect[0] - local_26c.smallend.vect[0]) + 1;
                  do {
                    *(undefined4 *)
                     ((long)&(((FabArray<amrex::CutFab> *)local_238._0_8_)->super_FabArrayBase).
                             _vptr_FabArrayBase +
                     (((long)iVar13 - (long)local_210) *
                      (long)local_228.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     ((long)iVar17 -
                     (long)local_228.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                     local_238._8_8_ + (long)iVar16) * 4) = 0xffffffff;
                    iVar16 = iVar16 + 1;
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                }
                bVar19 = iVar17 != local_26c.bigend.vect[1];
                iVar17 = iVar17 + 1;
              } while (bVar19);
            }
            bVar19 = iVar13 != local_26c.bigend.vect[2];
            iVar13 = iVar13 + 1;
          } while (bVar19);
        }
      }
      else if (FVar7 == singlevalued) {
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_238._0_8_ = (int *)0x0;
        local_238._8_8_ = (ostream *)0x0;
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)local_228.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffff00000000);
        amrex::BoxIterator::define((BoxIterator *)local_238,&local_b0);
        if ((int)local_238._8_4_ <=
            (int)local_228.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          do {
            if (((int)local_228.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage == local_238._8_4_) &&
               ((local_228.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish._4_4_ < (int)local_238._4_4_ ||
                ((local_228.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish._4_4_ == local_238._4_4_ &&
                 ((int)local_228.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish < (int)local_238._0_4_))))))
            break;
            bVar19 = (int)local_228.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish <= (int)local_238._0_4_;
            local_238._0_4_ = local_238._0_4_ + 1;
            if ((bVar19) &&
               (bVar19 = local_228.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_ <= (int)local_238._4_4_,
               local_238._4_4_ = local_238._4_4_ + 1, local_238._0_4_ = local_238._12_4_, bVar19)) {
              local_238._8_4_ = local_238._8_4_ + 1;
              local_238._4_4_ =
                   (int)local_228.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
          } while ((int)local_238._8_4_ <=
                   (int)local_228.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_238._0_8_ = (MultiCutFab *)0x0;
        local_238._8_8_ = (MultiCutFab *)0x0;
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)local_228.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffff00000000);
        amrex::BoxIterator::define((BoxIterator *)local_238,&local_b0);
        while( true ) {
          if ((int)local_228.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage < (int)local_238._8_4_) break;
          uVar3 = local_238._0_4_;
          uVar4 = local_238._4_4_;
          if (((int)local_228.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage == local_238._8_4_) &&
             ((local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish._4_4_ < (int)local_238._4_4_ ||
              ((local_228.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish._4_4_ == local_238._4_4_ &&
               ((int)local_228.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish < (int)local_238._0_4_)))))) break;
          iVar13 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
          iVar17 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
          uVar15 = (this_00->super_BaseFab<amrex::EBCellFlag>).dptr
                   [(long)(local_238._0_4_ - iVar13) +
                    (long)(((((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] -
                             iVar17) + 1) *
                            (local_238._8_4_ -
                            (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2]) +
                           (local_238._4_4_ - iVar17)) *
                          (((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] -
                           iVar13) + 1))].flag & 3;
          if (uVar15 == 0) {
            iVar13 = (pBVar1->domain).smallend.vect[0];
            if ((((iVar13 <= (int)local_238._0_4_) &&
                 ((pBVar1->domain).smallend.vect[1] <= (int)local_238._4_4_)) &&
                ((pBVar1->domain).smallend.vect[2] <= (int)local_238._8_4_)) &&
               (((int)local_238._0_4_ <= (pBVar1->domain).bigend.vect[0] &&
                ((int)local_238._4_4_ <= (pBVar1->domain).bigend.vect[1])))) {
              iVar17 = 1;
              goto LAB_00231730;
            }
          }
          else if (uVar15 == 3) {
            iVar13 = (pBVar1->domain).smallend.vect[0];
            if ((((iVar13 <= (int)local_238._0_4_) &&
                 ((pBVar1->domain).smallend.vect[1] <= (int)local_238._4_4_)) &&
                ((pBVar1->domain).smallend.vect[2] <= (int)local_238._8_4_)) &&
               (((int)local_238._0_4_ <= (pBVar1->domain).bigend.vect[0] &&
                ((int)local_238._4_4_ <= (pBVar1->domain).bigend.vect[1])))) {
              iVar17 = -1;
LAB_00231730:
              if ((int)local_238._8_4_ <= (pBVar1->domain).bigend.vect[2]) {
                iVar16 = (pBVar1->domain).smallend.vect[1];
                pBVar1->dptr
                [(long)(local_238._0_4_ - iVar13) +
                 (long)(((((pBVar1->domain).bigend.vect[1] - iVar16) + 1) *
                         (local_238._8_4_ - (pBVar1->domain).smallend.vect[2]) +
                        (local_238._4_4_ - iVar16)) *
                       (((pBVar1->domain).bigend.vect[0] - iVar13) + 1))] = iVar17;
              }
            }
          }
          else {
            iVar13 = (pBVar1->domain).smallend.vect[0];
            if (((iVar13 <= (int)local_238._0_4_) &&
                ((pBVar1->domain).smallend.vect[1] <= (int)local_238._4_4_)) &&
               (((pBVar1->domain).smallend.vect[2] <= (int)local_238._8_4_ &&
                (((int)local_238._0_4_ <= (pBVar1->domain).bigend.vect[0] &&
                 ((int)local_238._4_4_ <= (pBVar1->domain).bigend.vect[1])))))) {
              iVar17 = 0;
              goto LAB_00231730;
            }
          }
          local_238._0_4_ = local_238._0_4_ + 1;
          if ((int)local_228.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish <= (int)uVar3) {
            local_238._4_4_ = local_238._4_4_ + 1;
            local_238._0_4_ = local_238._12_4_;
            if (local_228.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish._4_4_ <= (int)uVar4) {
              local_238._4_4_ =
                   (int)local_228.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_238._8_4_ = local_238._8_4_ + 1;
            }
          }
        }
      }
      else if (FVar7 == regular) {
        amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                  ((Array4<int> *)local_238,local_240,&local_90);
        this = local_248;
        pFVar11 = local_250;
        if (local_26c.smallend.vect[2] <= local_26c.bigend.vect[2]) {
          iVar13 = local_26c.smallend.vect[2];
          do {
            if (local_26c.smallend.vect[1] <= local_26c.bigend.vect[1]) {
              iVar17 = local_26c.smallend.vect[1];
              do {
                if (local_26c.smallend.vect[0] <= local_26c.bigend.vect[0]) {
                  iVar16 = local_26c.smallend.vect[0] -
                           (int)local_228.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  iVar18 = (local_26c.bigend.vect[0] - local_26c.smallend.vect[0]) + 1;
                  do {
                    *(undefined4 *)
                     ((long)&(((FabArray<amrex::CutFab> *)local_238._0_8_)->super_FabArrayBase).
                             _vptr_FabArrayBase +
                     (((long)iVar13 - (long)local_210) *
                      (long)local_228.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     ((long)iVar17 -
                     (long)local_228.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                     local_238._8_8_ + (long)iVar16) * 4) = 1;
                    iVar16 = iVar16 + 1;
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                }
                bVar19 = iVar17 != local_26c.bigend.vect[1];
                iVar17 = iVar17 + 1;
              } while (bVar19);
            }
            bVar19 = iVar13 != local_26c.bigend.vect[2];
            iVar13 = iVar13 + 1;
          } while (bVar19);
        }
      }
      else {
        local_238._8_8_ = amrex::OutStream();
        local_238._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
        local_238._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
        *(undefined8 *)
         ((long)&local_228.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         (long)(((MultiCutFab *)
                ((long)local_228.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + -0x188))->m_data).pcd._M_t.
               super___uniq_ptr_impl<amrex::PCData<amrex::CutFab>,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::PCData<amrex::CutFab>_*,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
               .super__Head_base<0UL,_amrex::PCData<amrex::CutFab>_*,_false>._M_head_impl) =
             *(undefined8 *)
              ((long)&(((FabArray<amrex::CutFab> *)local_238._8_8_)->super_FabArrayBase).boxarray.
                      m_bat.m_bat_type +
              (long)(((FabArray<amrex::CutFab> *)local_238._8_8_)->super_FabArrayBase).
                    _vptr_FabArrayBase[-3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,"unknown (or multivalued) fab type",0x21);
        cVar2 = (char)(ostringstream *)&local_228;
        std::ios::widen((char)(((MultiCutFab *)
                               ((long)local_228.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + -0x188))->m_data).
                              pcd._M_t.
                              super___uniq_ptr_impl<amrex::PCData<amrex::CutFab>,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::PCData<amrex::CutFab>_*,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
                              .super__Head_base<0UL,_amrex::PCData<amrex::CutFab>_*,_false>.
                              _M_head_impl + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        amrex::Print::~Print((Print *)local_238);
        amrex::Abort_host((char *)0x0);
      }
      amrex::MFIter::operator++(&local_90);
      pFVar5 = local_250;
      pNVar6 = local_248;
    } while (local_90.currentIndex < local_90.endIndex);
  }
  amrex::MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
NavierStokesBase::initialize_eb2_structs() {

  amrex::Print() << "Initializing EB2 structs" << std::endl;

  // NOTE: THIS NEEDS TO BE REPLACED WITH A FLAGFAB 
  
  // n.b., could set this to 1 if geometry is all_regular as an optimization
  no_eb_in_domain = 0;

  //  1->regular, 0->irregular, -1->covered, 2->outside
  ebmask.define(grids, dmap,  1, 0);
  
  const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Factory());

  // These are the data sources
  volfrac = &(ebfactory.getVolFrac());
  bndrycent = &(ebfactory.getBndryCent());
  areafrac = ebfactory.getAreaFrac();
  facecent = ebfactory.getFaceCent();
  
  auto const& flags = ebfactory.getMultiEBCellFlagFab();

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
  for (MFIter mfi(*volfrac, false); mfi.isValid(); ++mfi)
  {
    BaseFab<int>& mfab = ebmask[mfi];
    const Box tbox = mfi.growntilebox();
    const Box bx = mfi.tilebox();
    const EBCellFlagFab& flagfab = flags[mfi];
    
    FabType typ = flagfab.getType(tbox);

    if (typ == FabType::regular) {
      const auto& mask = ebmask.array(mfi);
      amrex::ParallelFor(bx, [mask]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
          mask(i,j,k) = 1;
      });
    }
    else if (typ == FabType::covered) {
      const auto& mask = ebmask.array(mfi);
      amrex::ParallelFor(bx, [mask]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
          mask(i,j,k) = -1;
      });
    }
    else if (typ == FabType::singlevalued) {
      int Ncut = 0;
      for (BoxIterator bit(tbox); bit.ok(); ++bit) {
        const EBCellFlag& flag = flagfab(bit(), 0);
    
        if (!(flag.isRegular() || flag.isCovered())) {
          Ncut++;
        }
      }
    
      for (BoxIterator bit(tbox); bit.ok(); ++bit) {
        const EBCellFlag& flag = flagfab(bit(), 0);
    
        if (!(flag.isRegular() || flag.isCovered())) {
          if (mfab.box().contains(bit())) mfab(bit()) = 0;
        } else {
          if (flag.isRegular()) {
            if (mfab.box().contains(bit())) mfab(bit()) = 1;
          } else if (flag.isCovered()) {
            if (mfab.box().contains(bit())) mfab(bit()) = -1;
          } else {
            if (mfab.box().contains(bit())) mfab(bit()) = 2;
          }
        }
      }
    }
    else {
      amrex::Print() << "unknown (or multivalued) fab type" << std::endl;
      amrex::Abort();
    }   
  }
}